

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  string filename;
  cmXMLWriter xml;
  string name;
  cmGeneratedFileStream fout;
  string local_340;
  string local_320;
  undefined1 local_300 [88];
  string local_2a8;
  undefined1 local_288 [32];
  byte abStack_268 [584];
  
  __n = (this->HomeDirectory)._M_string_length;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n != 0) {
      iVar4 = bcmp((this->HomeDirectory)._M_dataplus._M_p,
                   (this->HomeOutputDirectory)._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_0050fc91;
    }
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0xca,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
LAB_0050fc91:
  cmLocalGenerator::GetProjectName_abi_cxx11_
            ((string *)local_288,
             (cmLocalGenerator *)
             (((((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators)
               .
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  local_300._0_8_ = local_300 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Source","");
  GetPathBasename(&local_320,&this->HomeDirectory);
  GenerateProjectName(&local_2a8,(string *)local_288,(string *)local_300,&local_320);
  paVar1 = &local_320.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  pcVar3 = (this->HomeDirectory)._M_dataplus._M_p;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar3,pcVar3 + (this->HomeDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_320);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_288,&local_320,false,None);
  if ((abStack_268[*(long *)(local_288._0_8_ + -0x18)] & 5) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_300,(ostream *)local_288,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_300,"UTF-8");
    paVar2 = &local_340.field_2;
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"projectDescription","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"name","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_300,&local_2a8);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"comment","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_300,(char (*) [1])0x9042b9);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"projects","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_300,(char (*) [1])0x9042b9);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"buildSpec","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_300,(char (*) [1])0x9042b9);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"natures","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_300,(char (*) [1])0x9042b9);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"linkedResources","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_300,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (this->SupportsVirtualFolders == true) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_300,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->SrcLinkedResources,
                        (this->SrcLinkedResources).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    cmXMLWriter::EndElement((cmXMLWriter *)local_300);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_300);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_300);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}